

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

bool __thiscall
boost::asio::detail::posix_event::
maybe_unlock_and_signal_one<boost::asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  bool bVar2;
  scoped_lock *in_RSI;
  pthread_cond_t *in_RDI;
  
  bVar2 = conditionally_enabled_mutex::scoped_lock::locked(in_RSI);
  if (bVar2) {
    in_RDI[1].__align = in_RDI[1].__align | 1;
    uVar1 = in_RDI[1].__align;
    if (1 < uVar1) {
      conditionally_enabled_mutex::scoped_lock::unlock((scoped_lock *)&in_RDI->__data);
      pthread_cond_signal(in_RDI);
    }
    return 1 < uVar1;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/asio/detail/posix_event.hpp"
                ,0x4e,
                "bool boost::asio::detail::posix_event::maybe_unlock_and_signal_one(Lock &) [Lock = boost::asio::detail::conditionally_enabled_mutex::scoped_lock]"
               );
}

Assistant:

bool maybe_unlock_and_signal_one(Lock& lock)
  {
    BOOST_ASIO_ASSERT(lock.locked());
    state_ |= 1;
    if (state_ > 1)
    {
      lock.unlock();
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
      return true;
    }
    return false;
  }